

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

event_change *
event_changelist_get_or_construct
          (event_changelist *changelist,int fd,short old_events,event_changelist_fdinfo *fdinfo)

{
  long lVar1;
  event_change *peVar2;
  int iVar3;
  ulong uVar4;
  
  lVar1 = (long)fdinfo->idxplus1;
  if (lVar1 == 0) {
    iVar3 = changelist->n_changes;
    if (iVar3 <= changelist->changes_size) {
      peVar2 = changelist->changes;
      if (iVar3 == changelist->changes_size) {
        uVar4 = 0x40;
        if (0x3f < iVar3) {
          uVar4 = (ulong)(uint)(iVar3 * 2);
        }
        peVar2 = (event_change *)event_mm_realloc_(peVar2,uVar4 * 0xc);
        if (peVar2 == (event_change *)0x0) {
          return (event_change *)0x0;
        }
        changelist->changes = peVar2;
        changelist->changes_size = (int)uVar4;
        iVar3 = changelist->n_changes;
      }
      changelist->n_changes = iVar3 + 1;
      peVar2 = peVar2 + iVar3;
      fdinfo->idxplus1 = iVar3 + 1;
      peVar2->old_events = 0;
      peVar2->read_change = '\0';
      peVar2->write_change = '\0';
      peVar2->close_change = '\0';
      *(undefined3 *)&peVar2->field_0x9 = 0;
      peVar2->fd = fd;
      peVar2->old_events = old_events;
      return peVar2;
    }
  }
  else {
    if (changelist->changes[lVar1 + -1].fd == fd) {
      return changelist->changes + lVar1 + -1;
    }
    event_changelist_get_or_construct_cold_1();
  }
  event_changelist_get_or_construct_cold_2();
  return (event_change *)0x0;
}

Assistant:

static struct event_change *
event_changelist_get_or_construct(struct event_changelist *changelist,
    evutil_socket_t fd,
    short old_events,
    struct event_changelist_fdinfo *fdinfo)
{
	struct event_change *change;

	if (fdinfo->idxplus1 == 0) {
		int idx;
		EVUTIL_ASSERT(changelist->n_changes <= changelist->changes_size);

		if (changelist->n_changes == changelist->changes_size) {
			if (event_changelist_grow(changelist) < 0)
				return NULL;
		}

		idx = changelist->n_changes++;
		change = &changelist->changes[idx];
		fdinfo->idxplus1 = idx + 1;

		memset(change, 0, sizeof(struct event_change));
		change->fd = fd;
		change->old_events = old_events;
	} else {
		change = &changelist->changes[fdinfo->idxplus1 - 1];
		EVUTIL_ASSERT(change->fd == fd);
	}
	return change;
}